

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngunknown.c
# Opt level: O2

int check(FILE *fp,int argc,char **argv,png_uint_32p flags,display *d,int set_callback)

{
  int *__s;
  char cVar1;
  int iVar2;
  int iVar3;
  png_uint_32 pVar4;
  uint uVar5;
  uint uVar6;
  png_structp ppVar7;
  png_infop ppVar8;
  char *pcVar9;
  ulong uVar10;
  byte bVar11;
  anon_struct_32_7_46fe1f00 *paVar12;
  char *pcVar13;
  int after_IDAT;
  int after_IDAT_00;
  uint uVar14;
  char *pcVar15;
  uint uVar16;
  png_uint_32 y;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  bool bVar21;
  png_byte name [5];
  
  d->keep = 0;
  d->before_IDAT = 0;
  d->after_IDAT = 0;
  ppVar7 = (png_structp)png_create_read_struct("1.6.48.git",d,error,warning);
  d->png_ptr = ppVar7;
  if (ppVar7 == (png_structp)0x0) {
    fprintf(_stderr,"%s(%s): could not allocate png struct\n",d->file,d->test);
  }
  else {
    ppVar8 = (png_infop)png_create_info_struct(ppVar7);
    d->info_ptr = ppVar8;
    ppVar8 = (png_infop)png_create_info_struct(d->png_ptr);
    d->end_ptr = ppVar8;
    if ((d->info_ptr == (png_infop)0x0) || (ppVar8 == (png_infop)0x0)) {
      pcVar9 = d->file;
      pcVar13 = d->test;
      pcVar15 = "%s(%s): could not allocate png info\n";
    }
    else {
      png_init_io(d->png_ptr,fp);
      if (set_callback != 0) {
        png_set_read_user_chunk_fn(d->png_ptr,d,read_callback);
      }
      uVar17 = 0;
      uVar20 = (ulong)(uint)argc;
      if (argc < 1) {
        uVar20 = uVar17;
      }
      for (; uVar17 != uVar20; uVar17 = uVar17 + 1) {
        __s = (int *)argv[uVar17];
        pcVar9 = strchr((char *)__s,0x3d);
        if (pcVar9 == (char *)0x0) {
LAB_00102b52:
          pcVar9 = d->file;
          pcVar13 = d->test;
          pcVar15 = "%s(%s): %s: unrecognized chunk argument\n";
LAB_00102b75:
          fprintf(_stderr,pcVar15,pcVar9,pcVar13,__s);
          display_exit(d);
        }
        pcVar13 = pcVar9 + 1;
        iVar2 = strcmp(pcVar13,"default");
        if (iVar2 == 0) {
          iVar2 = 0;
        }
        else {
          iVar3 = strcmp(pcVar13,"discard");
          iVar2 = 1;
          if (iVar3 != 0) {
            iVar3 = strcmp(pcVar13,"if-safe");
            iVar2 = 2;
            if (iVar3 != 0) {
              iVar3 = strcmp(pcVar13,"save");
              iVar2 = 3;
              if (iVar3 != 0) {
                pcVar9 = d->file;
                pcVar13 = d->test;
                pcVar15 = "%s(%s): %s: unrecognized chunk option\n";
                goto LAB_00102b75;
              }
            }
          }
        }
        lVar18 = (long)pcVar9 - (long)__s;
        if (lVar18 == 3) {
          iVar3 = bcmp(__s,"all",3);
          if (iVar3 == 0) {
            png_set_keep_unknown_chunks(d->png_ptr,iVar2,0,0xffffffffffffffff);
            d->keep = iVar2;
            for (lVar18 = 0x1c; lVar18 != 0x33c; lVar18 = lVar18 + 0x20) {
              if (*(int *)((long)standard_tests + lVar18 + 0xe8) != 0) {
                *(int *)(chunk_info[0].name + lVar18) = iVar2;
              }
            }
            goto LAB_00102914;
          }
          goto LAB_00102b52;
        }
        if (lVar18 == 7) {
          iVar3 = bcmp(__s,"default",7);
          if (iVar3 != 0) goto LAB_00102b52;
          png_set_keep_unknown_chunks(d->png_ptr,iVar2,0,0);
          d->keep = iVar2;
        }
        else {
          if (lVar18 != 4) goto LAB_00102b52;
          paVar12 = chunk_info + 0x18;
          uVar10 = 0x19;
          do {
            bVar21 = uVar10 == 0;
            uVar10 = uVar10 - 1;
            if (bVar21) goto LAB_00102b52;
            pcVar9 = paVar12->name;
            paVar12 = paVar12 + -1;
          } while (*(int *)pcVar9 != *__s);
          uVar10 = uVar10 & 0xffffffff;
          name[4] = chunk_info[uVar10].name[4];
          name._0_4_ = *(undefined4 *)chunk_info[uVar10].name;
          png_set_keep_unknown_chunks(d->png_ptr,iVar2,name,1);
          chunk_info[uVar10].keep = iVar2;
        }
LAB_00102914:
      }
      png_read_info(d->png_ptr,d->info_ptr);
      cVar1 = png_get_interlace_type(d->png_ptr,d->info_ptr);
      if (cVar1 == '\0') {
        uVar14 = 1;
        bVar21 = false;
LAB_001029b3:
        if (chunk_info[0].keep == 0) {
          png_start_read_image(d->png_ptr);
          uVar5 = png_get_image_height(d->png_ptr,d->info_ptr);
          if (bVar21) {
            iVar2 = png_get_image_width(d->png_ptr,d->info_ptr);
            uVar19 = 0;
            while (uVar19 != uVar14) {
              uVar6 = 7 - uVar19;
              bVar11 = (byte)(uVar6 >> 1);
              if (uVar19 < 2) {
                bVar11 = 3;
              }
              uVar16 = uVar19 & 1;
              uVar19 = uVar19 + 1;
              if ((~(-1 << (bVar11 & 0x1f)) + iVar2) -
                  (uVar16 << (3U - (char)(uVar19 >> 1) & 0x1f) & 7) >> (bVar11 & 0x1f) != 0) {
                bVar11 = (char)uVar6 * '\x04';
                for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
                  if (((0x1145af0U >> (bVar11 & 0x1f) & 0xf0 | 0x110145afU >> (bVar11 & 0x1f) & 0xf)
                       >> (uVar6 & 7) & 1) != 0) {
                    png_read_row(d->png_ptr,0,0);
                  }
                }
              }
            }
          }
          else {
            while (bVar21 = uVar5 != 0, uVar5 = uVar5 - 1, bVar21) {
              png_read_row(d->png_ptr,0,0);
            }
          }
        }
        png_read_end(d->png_ptr,d->end_ptr);
        pVar4 = get_valid(d,d->info_ptr);
        *flags = pVar4;
        pVar4 = get_unknown(d,d->info_ptr,after_IDAT);
        flags[1] = pVar4;
        flags[chunk_info[0].keep != 0] = flags[chunk_info[0].keep != 0] | 0x8000;
        pVar4 = get_valid(d,d->end_ptr);
        flags[2] = pVar4;
        pVar4 = get_unknown(d,d->end_ptr,after_IDAT_00);
        flags[3] = pVar4;
        clean_display(d);
        return d->keep;
      }
      if (cVar1 == '\x01') {
        uVar14 = 7;
        bVar21 = true;
        goto LAB_001029b3;
      }
      pcVar9 = d->file;
      pcVar13 = d->test;
      pcVar15 = "%s(%s): invalid interlace type\n";
    }
    fprintf(_stderr,pcVar15,pcVar9,pcVar13);
    clean_display(d);
  }
  exit(1);
}

Assistant:

static int
check(FILE *fp, int argc, const char **argv, png_uint_32p flags/*out*/,
   display *d, int set_callback)
{
   int i, npasses, ipass;
   png_uint_32 height;

   d->keep = PNG_HANDLE_CHUNK_AS_DEFAULT;
   d->before_IDAT = 0;
   d->after_IDAT = 0;

   /* Some of these errors are permanently fatal and cause an exit here, others
    * are per-test and cause an error return.
    */
   d->png_ptr = png_create_read_struct(PNG_LIBPNG_VER_STRING, d, error,
      warning);
   if (d->png_ptr == NULL)
   {
      fprintf(stderr, "%s(%s): could not allocate png struct\n", d->file,
         d->test);
      /* Terminate here, this error is not test specific. */
      exit(1);
   }

   d->info_ptr = png_create_info_struct(d->png_ptr);
   d->end_ptr = png_create_info_struct(d->png_ptr);
   if (d->info_ptr == NULL || d->end_ptr == NULL)
   {
      fprintf(stderr, "%s(%s): could not allocate png info\n", d->file,
         d->test);
      clean_display(d);
      exit(1);
   }

   png_init_io(d->png_ptr, fp);

#  ifdef PNG_READ_USER_CHUNKS_SUPPORTED
      /* This is only done if requested by the caller; it interferes with the
       * standard store/save mechanism.
       */
      if (set_callback)
         png_set_read_user_chunk_fn(d->png_ptr, d, read_callback);
#  else
      UNUSED(set_callback)
#  endif

   /* Handle each argument in turn; multiple settings are possible for the same
    * chunk and multiple calls will occur (the last one should override all
    * preceding ones).
    */
   for (i=0; i<argc; ++i)
   {
      const char *equals = strchr(argv[i], '=');

      if (equals != NULL)
      {
         int chunk, option;

         if (strcmp(equals+1, "default") == 0)
            option = PNG_HANDLE_CHUNK_AS_DEFAULT;
         else if (strcmp(equals+1, "discard") == 0)
            option = PNG_HANDLE_CHUNK_NEVER;
         else if (strcmp(equals+1, "if-safe") == 0)
            option = PNG_HANDLE_CHUNK_IF_SAFE;
         else if (strcmp(equals+1, "save") == 0)
            option = PNG_HANDLE_CHUNK_ALWAYS;
         else
         {
            fprintf(stderr, "%s(%s): %s: unrecognized chunk option\n", d->file,
               d->test, argv[i]);
            display_exit(d);
         }

         switch (equals - argv[i])
         {
            case 4: /* chunk name */
               chunk = find(argv[i]);

               if (chunk >= 0)
               {
                  /* These #if tests have the effect of skipping the arguments
                   * if SAVE support is unavailable - we can't do a useful test
                   * in this case, so we just check the arguments!  This could
                   * be improved in the future by using the read callback.
                   */
#                 if PNG_LIBPNG_VER >= 10700 &&\
                     !defined(PNG_SAVE_UNKNOWN_CHUNKS_SUPPORTED)
                     if (option < PNG_HANDLE_CHUNK_IF_SAFE)
#                 endif /* 1.7+ SAVE_UNKNOWN_CHUNKS */
                  {
                     png_byte name[5];

                     memcpy(name, chunk_info[chunk].name, 5);
                     png_set_keep_unknown_chunks(d->png_ptr, option, name, 1);
                     chunk_info[chunk].keep = option;
                  }
                  continue;
               }

               break;

            case 7: /* default */
               if (memcmp(argv[i], "default", 7) == 0)
               {
#                 if PNG_LIBPNG_VER >= 10700 &&\
                     !defined(PNG_SAVE_UNKNOWN_CHUNKS_SUPPORTED)
                     if (option < PNG_HANDLE_CHUNK_IF_SAFE)
#                 endif /* 1.7+ SAVE_UNKNOWN_CHUNKS */
                     png_set_keep_unknown_chunks(d->png_ptr, option, NULL, 0);

                  d->keep = option;
                  continue;
               }

               break;

            case 3: /* all */
               if (memcmp(argv[i], "all", 3) == 0)
               {
#                 if PNG_LIBPNG_VER >= 10700 &&\
                     !defined(PNG_SAVE_UNKNOWN_CHUNKS_SUPPORTED)
                     if (option < PNG_HANDLE_CHUNK_IF_SAFE)
#                 endif /* 1.7+ SAVE_UNKNOWN_CHUNKS */
                     png_set_keep_unknown_chunks(d->png_ptr, option, NULL, -1);

                  d->keep = option;

                  for (chunk = 0; chunk < NINFO; ++chunk)
                     if (chunk_info[chunk].all)
                        chunk_info[chunk].keep = option;
                  continue;
               }

               break;

            default: /* some misplaced = */

               break;
         }
      }

      fprintf(stderr, "%s(%s): %s: unrecognized chunk argument\n", d->file,
         d->test, argv[i]);
      display_exit(d);
   }

   png_read_info(d->png_ptr, d->info_ptr);

   switch (png_get_interlace_type(d->png_ptr, d->info_ptr))
   {
      case PNG_INTERLACE_NONE:
         npasses = 1;
         break;

      case PNG_INTERLACE_ADAM7:
         npasses = PNG_INTERLACE_ADAM7_PASSES;
         break;

      default:
         /* Hard error because it is not test specific */
         fprintf(stderr, "%s(%s): invalid interlace type\n", d->file, d->test);
         clean_display(d);
         exit(1);
   }

   /* Skip the image data, if IDAT is not being handled then don't do this
    * because it will cause a CRC error.
    */
   if (chunk_info[0/*IDAT*/].keep == PNG_HANDLE_CHUNK_AS_DEFAULT)
   {
      png_start_read_image(d->png_ptr);
      height = png_get_image_height(d->png_ptr, d->info_ptr);

      if (npasses > 1)
      {
         png_uint_32 width = png_get_image_width(d->png_ptr, d->info_ptr);

         for (ipass=0; ipass<npasses; ++ipass)
         {
            png_uint_32 wPass = PNG_PASS_COLS(width, ipass);

            if (wPass > 0)
            {
               png_uint_32 y;

               for (y=0; y<height; ++y)
                  if (PNG_ROW_IN_INTERLACE_PASS(y, ipass))
                     png_read_row(d->png_ptr, NULL, NULL);
            }
         }
      } /* interlaced */

      else /* not interlaced */
      {
         png_uint_32 y;

         for (y=0; y<height; ++y)
            png_read_row(d->png_ptr, NULL, NULL);
      }
   }

   png_read_end(d->png_ptr, d->end_ptr);

   flags[0] = get_valid(d, d->info_ptr);
   flags[1] = get_unknown(d, d->info_ptr, 0/*before IDAT*/);

   /* Only png_read_png sets PNG_INFO_IDAT! */
   flags[chunk_info[0/*IDAT*/].keep != PNG_HANDLE_CHUNK_AS_DEFAULT] |=
      PNG_INFO_IDAT;

   flags[2] = get_valid(d, d->end_ptr);
   flags[3] = get_unknown(d, d->end_ptr, 1/*after IDAT*/);

   clean_display(d);

   return d->keep;
}